

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O0

void __thiscall Block::Block(Block *this)

{
  Block *this_local;
  
  std::__cxx11::string::string((string *)this);
  BlockClear(this);
  return;
}

Assistant:

Block::Block(void) {
	this->BlockClear();
}